

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

size_t buffer_input(AvxInputContext *input_ctx,size_t n,uchar *buf,_Bool buffered)

{
  byte bVar1;
  byte in_CL;
  AvxInputContext *in_RDX;
  uchar *in_RSI;
  size_t buf_n;
  uchar *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  bVar1 = in_CL & 1;
  if (bVar1 == 0) {
    local_8 = (uchar *)read_from_input(in_RDX,CONCAT17(in_CL,in_stack_ffffffffffffffd8) &
                                              0x1ffffffffffffff,in_stack_ffffffffffffffd0);
  }
  else {
    local_8 = (uchar *)input_to_detect_buf(in_RDX,CONCAT17(in_CL,in_stack_ffffffffffffffd8) &
                                                  0x1ffffffffffffff);
    if (in_RSI <= local_8) {
      local_8 = (uchar *)read_from_input(in_RDX,CONCAT17(bVar1,in_stack_ffffffffffffffd8),local_8);
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t buffer_input(struct AvxInputContext *input_ctx, size_t n,
                    unsigned char *buf, bool buffered) {
  if (!buffered) {
    return read_from_input(input_ctx, n, buf);
  }
  const size_t buf_n = input_to_detect_buf(input_ctx, n);
  if (buf_n < n) {
    return buf_n;
  }
  return read_from_input(input_ctx, n, buf);
}